

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O0

int ShouldMergeBlock(BrotliOnePassArena *s,uint8_t *data,size_t len,uint8_t *depths)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  void *__s;
  ulong uVar4;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 uVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  double r;
  size_t total;
  size_t i;
  uint32_t *histo;
  double local_60;
  ulong local_50;
  double local_18;
  double local_8;
  
  __s = (void *)(in_RDI + 0x1890);
  memset(__s,0,0x400);
  for (local_50 = 0; local_50 < in_RDX; local_50 = local_50 + 0x2b) {
    *(int *)((long)__s + (ulong)*(byte *)(in_RSI + local_50) * 4) =
         *(int *)((long)__s + (ulong)*(byte *)(in_RSI + local_50) * 4) + 1;
  }
  uVar4 = (in_RDX + 0x2a) / 0x2b;
  uVar7 = (undefined4)(uVar4 >> 0x20);
  if (uVar4 < 0x100) {
    local_8 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar4 * 8);
  }
  else {
    auVar5._8_4_ = uVar7;
    auVar5._0_8_ = uVar4;
    auVar5._12_4_ = 0x45300000;
    local_8 = log2((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
  }
  auVar8._8_4_ = uVar7;
  auVar8._0_8_ = uVar4;
  auVar8._12_4_ = 0x45300000;
  local_60 = (local_8 + 0.5) *
             ((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) + 200.0;
  for (local_50 = 0; local_50 < 0x100; local_50 = local_50 + 1) {
    uVar2 = *(uint *)((long)__s + local_50 * 4);
    bVar1 = *(byte *)(in_RCX + local_50);
    uVar3 = *(uint *)((long)__s + local_50 * 4);
    uVar4 = CONCAT44(0,uVar3);
    if (uVar4 < 0x100) {
      local_18 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar4 * 8);
    }
    else {
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar4;
      auVar6._12_4_ = 0x45300000;
      local_18 = log2((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0));
    }
    local_60 = -(double)uVar2 * ((double)bVar1 + local_18) + local_60;
  }
  return (uint)(0.0 <= local_60);
}

Assistant:

static BROTLI_BOOL ShouldMergeBlock(BrotliOnePassArena* s,
    const uint8_t* data, size_t len, const uint8_t* depths) {
  uint32_t* BROTLI_RESTRICT const histo = s->histogram;
  static const size_t kSampleRate = 43;
  size_t i;
  memset(histo, 0, sizeof(s->histogram));
  for (i = 0; i < len; i += kSampleRate) {
    ++histo[data[i]];
  }
  {
    const size_t total = (len + kSampleRate - 1) / kSampleRate;
    double r = (FastLog2(total) + 0.5) * (double)total + 200;
    for (i = 0; i < 256; ++i) {
      r -= (double)histo[i] * (depths[i] + FastLog2(histo[i]));
    }
    return TO_BROTLI_BOOL(r >= 0.0);
  }
}